

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesBodyOwnMass::Compute_invMb_v
          (ChVariablesBodyOwnMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar7 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar11 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])();
  if (lVar7 != iVar11) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodyOwnMass.cpp"
                  ,0x3a,
                  "virtual void chrono::ChVariablesBodyOwnMass::Compute_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar7 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar11 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])(this);
  if (lVar7 != iVar11) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodyOwnMass.cpp"
                  ,0x3b,
                  "virtual void chrono::ChVariablesBodyOwnMass::Compute_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar7 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (0 < lVar7) {
    lVar8 = *(long *)&(result->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ).field_0x8;
    if (0 < lVar8) {
      pdVar9 = (vect->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_data;
      pdVar10 = *(double **)
                 &result->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      *pdVar10 = this->inv_mass * *pdVar9;
      if (lVar7 == 1) goto LAB_007fd344;
      if (lVar8 != 1) {
        pdVar10[1] = this->inv_mass * pdVar9[1];
        if (lVar7 < 3) goto LAB_007fd344;
        if (2 < lVar8) {
          pdVar10[2] = this->inv_mass * pdVar9[2];
          if (((lVar7 == 3) || (lVar7 < 5)) || (lVar7 == 5)) goto LAB_007fd344;
          if (lVar8 != 3) {
            auVar12._8_8_ = 0;
            auVar12._0_8_ =
                 (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar9[3];
            auVar15._8_8_ = 0;
            auVar15._0_8_ =
                 (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] * pdVar9[4];
            auVar1 = vfmadd231sd_fma(auVar15,auVar12,auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = pdVar9[5];
            auVar1 = vfmadd231sd_fma(auVar1,auVar18,auVar2);
            pdVar10[3] = auVar1._0_8_;
            if (4 < lVar8) {
              auVar13._8_8_ = 0;
              auVar13._0_8_ =
                   (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = pdVar9[3];
              auVar19._8_8_ = 0;
              auVar19._0_8_ =
                   (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] * pdVar9[4];
              auVar1 = vfmadd231sd_fma(auVar19,auVar16,auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar9[5];
              auVar1 = vfmadd231sd_fma(auVar1,auVar13,auVar4);
              pdVar10[4] = auVar1._0_8_;
              if (lVar8 != 5) {
                auVar14._8_8_ = 0;
                auVar14._0_8_ =
                     (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
                auVar17._8_8_ = 0;
                auVar17._0_8_ =
                     (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
                auVar5._8_8_ = 0;
                auVar5._0_8_ = pdVar9[3];
                auVar20._8_8_ = 0;
                auVar20._0_8_ =
                     (this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7] * pdVar9[4];
                auVar1 = vfmadd231sd_fma(auVar20,auVar17,auVar5);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = pdVar9[5];
                auVar1 = vfmadd231sd_fma(auVar1,auVar14,auVar6);
                pdVar10[5] = auVar1._0_8_;
                return;
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007fd344:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesBodyOwnMass::Compute_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    result(0) = inv_mass * vect(0);
    result(1) = inv_mass * vect(1);
    result(2) = inv_mass * vect(2);
    result(3) = inv_inertia(0, 0) * vect(3) + inv_inertia(0, 1) * vect(4) + inv_inertia(0, 2) * vect(5);
    result(4) = inv_inertia(1, 0) * vect(3) + inv_inertia(1, 1) * vect(4) + inv_inertia(1, 2) * vect(5);
    result(5) = inv_inertia(2, 0) * vect(3) + inv_inertia(2, 1) * vect(4) + inv_inertia(2, 2) * vect(5);
}